

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  size_t n;
  undefined1 auVar2 [16];
  int R [5];
  int T [10];
  uint local_58 [8];
  uint local_38 [10];
  long lVar3;
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[8] = 0;
  local_38[9] = 0;
  lVar1 = 1;
  auVar2 = _DAT_00102010;
  do {
    if (SUB164(auVar2 ^ _DAT_00102020,4) == -0x80000000 &&
        SUB164(auVar2 ^ _DAT_00102020,0) < -0x7ffffffb) {
      local_58[lVar1 + -1] = 10;
      local_58[lVar1] = 10;
    }
    lVar3 = auVar2._8_8_;
    auVar2._0_8_ = auVar2._0_8_ + 2;
    auVar2._8_8_ = lVar3 + 2;
    lVar1 = lVar1 + 2;
  } while (lVar1 != 7);
  lVar1 = 0;
  do {
    printf("%d ",(ulong)local_38[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  putchar(10);
  lVar1 = 0;
  do {
    printf("%d ",(ulong)local_58[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int T[10];
  int R[5];

  for (size_t n = 0; n < 10; n++) {
    T[n] = 0;
  }
  for (size_t n = 0; n < 5; n++) {
    R[n] = 10;
  }

  for (size_t n = 0; n < 10; n++) {
    printf("%d ", T[n]);
  }
  printf("\n");
  for (size_t n = 0; n < 5; n++) {
    printf("%d ", R[n]);
  }
  printf("\n");
}